

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::DebugNodeTabBar(ImGuiTabBar *tab_bar,char *label)

{
  ImGuiTabItem *tab;
  float fVar1;
  uint uVar2;
  ImGuiTabItem *pIVar3;
  ImGuiWindow *pIVar4;
  ImGuiContext *pIVar5;
  bool bVar6;
  bool bVar7;
  int iVar8;
  char *pcVar9;
  undefined8 uVar10;
  ulong uVar11;
  ImDrawList *this;
  long lVar12;
  int iVar13;
  char buf [256];
  ImVec2 local_148;
  ImVec2 local_140;
  char local_138 [264];
  
  iVar8 = tab_bar->PrevFrameVisible;
  iVar13 = GImGui->FrameCount + -2;
  pcVar9 = " *Inactive*";
  if (iVar13 <= iVar8) {
    pcVar9 = "";
  }
  ImFormatString(local_138,0x100,"%s 0x%08X (%d tabs)%s",label,(ulong)tab_bar->ID,
                 (ulong)(uint)(tab_bar->Tabs).Size,pcVar9);
  if (iVar8 < iVar13) {
    PushStyleColor(0,(GImGui->Style).Colors + 1);
  }
  bVar6 = TreeNode(tab_bar,"%s",local_138);
  if (iVar8 < iVar13) {
    PopStyleColor(1);
  }
  else {
    bVar7 = IsItemHovered(0);
    if (bVar7) {
      this = &GImGui->ForegroundDrawList;
      ImDrawList::AddRect(this,&(tab_bar->BarRect).Min,&(tab_bar->BarRect).Max,0xff00ffff,0.0,0xf,
                          1.0);
      local_140.y = (tab_bar->BarRect).Min.y;
      local_148.x = tab_bar->ScrollingRectMinX;
      local_148.y = (tab_bar->BarRect).Max.y;
      local_140.x = local_148.x;
      ImDrawList::AddLine(this,&local_140,&local_148,0xff00ff00,1.0);
      local_140.y = (tab_bar->BarRect).Min.y;
      local_148.x = tab_bar->ScrollingRectMaxX;
      local_148.y = (tab_bar->BarRect).Max.y;
      local_140.x = local_148.x;
      ImDrawList::AddLine(this,&local_140,&local_148,0xff00ff00,1.0);
    }
  }
  if (bVar6) {
    if (0 < (tab_bar->Tabs).Size) {
      lVar12 = 0;
      uVar11 = 0;
      do {
        pIVar3 = (tab_bar->Tabs).Data;
        tab = (ImGuiTabItem *)((long)&pIVar3->ID + lVar12);
        PushID(tab);
        bVar6 = SmallButton("<");
        if (bVar6) {
          TabBarQueueReorder(tab_bar,tab,-1);
        }
        pIVar4 = GImGui->CurrentWindow;
        pIVar4->WriteAccessed = true;
        if (pIVar4->SkipItems == false) {
          fVar1 = (pIVar4->DC).CursorPosPrevLine.y;
          (pIVar4->DC).CursorPos.x = (pIVar4->DC).CursorPosPrevLine.x + 2.0;
          (pIVar4->DC).CursorPos.y = fVar1;
          (pIVar4->DC).CurrLineSize = (pIVar4->DC).PrevLineSize;
          (pIVar4->DC).CurrLineTextBaseOffset = (pIVar4->DC).PrevLineTextBaseOffset;
        }
        bVar6 = SmallButton(">");
        if (bVar6) {
          TabBarQueueReorder(tab_bar,tab,1);
        }
        pIVar5 = GImGui;
        pIVar4 = GImGui->CurrentWindow;
        pIVar4->WriteAccessed = true;
        if (pIVar4->SkipItems == false) {
          (pIVar4->DC).CursorPos.x =
               (pIVar5->Style).ItemSpacing.x + (pIVar4->DC).CursorPosPrevLine.x;
          (pIVar4->DC).CursorPos.y = (pIVar4->DC).CursorPosPrevLine.y;
          (pIVar4->DC).CurrLineSize = (pIVar4->DC).PrevLineSize;
          (pIVar4->DC).CurrLineTextBaseOffset = (pIVar4->DC).PrevLineTextBaseOffset;
        }
        uVar2 = *(uint *)((long)&pIVar3->ID + lVar12);
        uVar10 = 0x20;
        if (uVar2 == tab_bar->SelectedTabId) {
          uVar10 = 0x2a;
        }
        iVar8 = (int)*(short *)((long)&pIVar3->NameOffset + lVar12);
        pcVar9 = "";
        if (iVar8 != -1) {
          if ((tab_bar->TabsNames).Buf.Size <= iVar8) {
            __assert_fail("tab->NameOffset != -1 && (int)tab->NameOffset < TabsNames.Buf.Size",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/imgui/imgui_internal.h"
                          ,0x762,"const char *ImGuiTabBar::GetTabName(const ImGuiTabItem *) const");
          }
          pcVar9 = (tab_bar->TabsNames).Buf.Data + iVar8;
        }
        Text("%02d%c Tab 0x%08X \'%s\' Offset: %.1f, Width: %.1f/%.1f",
             (double)*(float *)((long)&pIVar3->Offset + lVar12),
             (double)*(float *)((long)&pIVar3->Width + lVar12),
             (double)*(float *)((long)&pIVar3->ContentWidth + lVar12),uVar11 & 0xffffffff,uVar10,
             (ulong)uVar2,pcVar9);
        PopID();
        uVar11 = uVar11 + 1;
        lVar12 = lVar12 + 0x24;
      } while ((long)uVar11 < (long)(tab_bar->Tabs).Size);
    }
    TreePop();
  }
  return;
}

Assistant:

void ImGui::DebugNodeTabBar(ImGuiTabBar* tab_bar, const char* label)
{
    // Standalone tab bars (not associated to docking/windows functionality) currently hold no discernible strings.
    char buf[256];
    char* p = buf;
    const char* buf_end = buf + IM_ARRAYSIZE(buf);
    const bool is_active = (tab_bar->PrevFrameVisible >= GetFrameCount() - 2);
    p += ImFormatString(p, buf_end - p, "%s 0x%08X (%d tabs)%s", label, tab_bar->ID, tab_bar->Tabs.Size, is_active ? "" : " *Inactive*");
    IM_UNUSED(p);
    if (!is_active) { PushStyleColor(ImGuiCol_Text, GetStyleColorVec4(ImGuiCol_TextDisabled)); }
    bool open = TreeNode(tab_bar, "%s", buf);
    if (!is_active) { PopStyleColor(); }
    if (is_active && IsItemHovered())
    {
        ImDrawList* draw_list = GetForegroundDrawList();
        draw_list->AddRect(tab_bar->BarRect.Min, tab_bar->BarRect.Max, IM_COL32(255, 255, 0, 255));
        draw_list->AddLine(ImVec2(tab_bar->ScrollingRectMinX, tab_bar->BarRect.Min.y), ImVec2(tab_bar->ScrollingRectMinX, tab_bar->BarRect.Max.y), IM_COL32(0, 255, 0, 255));
        draw_list->AddLine(ImVec2(tab_bar->ScrollingRectMaxX, tab_bar->BarRect.Min.y), ImVec2(tab_bar->ScrollingRectMaxX, tab_bar->BarRect.Max.y), IM_COL32(0, 255, 0, 255));
    }
    if (open)
    {
        for (int tab_n = 0; tab_n < tab_bar->Tabs.Size; tab_n++)
        {
            const ImGuiTabItem* tab = &tab_bar->Tabs[tab_n];
            PushID(tab);
            if (SmallButton("<")) { TabBarQueueReorder(tab_bar, tab, -1); } SameLine(0, 2);
            if (SmallButton(">")) { TabBarQueueReorder(tab_bar, tab, +1); } SameLine();
            Text("%02d%c Tab 0x%08X '%s' Offset: %.1f, Width: %.1f/%.1f",
                tab_n, (tab->ID == tab_bar->SelectedTabId) ? '*' : ' ', tab->ID, (tab->NameOffset != -1) ? tab_bar->GetTabName(tab) : "", tab->Offset, tab->Width, tab->ContentWidth);
            PopID();
        }
        TreePop();
    }
}